

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_tasking.cpp
# Opt level: O0

kmp_int32 __kmpc_omp_taskwait_template<true>
                    (ident_t *loc_ref,kmp_int32 gtid,void *frame_address,void *return_address)

{
  kmp_info_t *pkVar1;
  kmp_taskdata_t *pkVar2;
  ompt_data_t *poVar3;
  ompt_team_info_t *poVar4;
  void *pvVar5;
  void *in_RCX;
  ompt_data_t in_RDX;
  int in_ESI;
  ident_t *in_RDI;
  kmp_flag_32 flag;
  bool must_wait;
  void *itt_sync_obj;
  ompt_data_t *my_parallel_data;
  ompt_data_t *my_task_data;
  int thread_finished;
  kmp_info_t *thread;
  kmp_taskdata_t *taskdata;
  memory_order __b;
  int in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  atomic<int> *thread_finished_00;
  ushort uVar6;
  undefined3 uVar7;
  uint in_stack_ffffffffffffff64;
  uint uVar8;
  kmp_info_t *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  kmp_int32 in_stack_ffffffffffffff80;
  kmp_int32 gtid_00;
  
  if (__kmp_tasking_mode != tskm_immediate_exec) {
    pkVar1 = __kmp_threads[in_ESI];
    pkVar2 = (pkVar1->th).th_current_task;
    poVar3 = &(pkVar2->ompt_task_info).task_data;
    poVar4 = &(((pkVar1->th).th_team)->t).ompt_team_info;
    (pkVar2->ompt_task_info).frame.enter_frame = in_RDX;
    if (((ulong)ompt_enabled >> 0x17 & 1) != 0) {
      (*ompt_callbacks.ompt_callback_sync_region_callback)
                (ompt_sync_region_taskwait,ompt_scope_begin,&poVar4->parallel_data,poVar3,in_RCX);
    }
    if (((ulong)ompt_enabled >> 0x10 & 1) != 0) {
      (*ompt_callbacks.ompt_callback_sync_region_wait_callback)
                (ompt_sync_region_taskwait,ompt_scope_begin,&poVar4->parallel_data,poVar3,in_RCX);
    }
    pkVar2->td_taskwait_counter = pkVar2->td_taskwait_counter + 1;
    pkVar2->td_taskwait_ident = in_RDI;
    pkVar2->td_taskwait_thread = in_ESI + 1;
    pvVar5 = __kmp_itt_taskwait_object(in_stack_ffffffffffffff64);
    if (pvVar5 != (void *)0x0) {
      __kmp_itt_taskwait_starting(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
    }
    uVar8 = in_stack_ffffffffffffff64 & 0xffffff;
    if (((uint)pkVar2->td_flags >> 0x13 & 1) == 0) {
      uVar8 = CONCAT13(((uint)pkVar2->td_flags >> 1 & 1) != 0,(int3)in_stack_ffffffffffffff64) ^
              0xff000000;
    }
    uVar7 = CONCAT12(1,(ushort)uVar8);
    if ((uVar8 & 0x1000000) == 0) {
      uVar6 = (ushort)uVar8 & 0xff;
      if ((pkVar1->th).th_task_team != (kmp_task_team_t *)0x0) {
        uVar6 = CONCAT11((((pkVar1->th).th_task_team)->tt).tt_found_proxy_tasks != 0,(char)uVar8);
      }
      uVar7 = CONCAT12((char)(uVar6 >> 8),uVar6);
    }
    gtid_00 = CONCAT13((char)(uVar8 >> 0x18),uVar7);
    if ((char)((uint3)uVar7 >> 0x10) != '\0') {
      kmp_flag_32::kmp_flag_32
                ((kmp_flag_32 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (atomic<unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
      while( true ) {
        thread_finished_00 = &pkVar2->td_incomplete_child_tasks;
        std::operator&(memory_order_acquire,__memory_order_mask);
        if ((thread_finished_00->super___atomic_base<int>)._M_i == 0) break;
        in_stack_ffffffffffffff48 = __kmp_task_stealing_constraint;
        kmp_flag_32::execute_tasks
                  ((kmp_flag_32 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68,gtid_00,2,(int *)thread_finished_00,
                   (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff80);
      }
    }
    if (pvVar5 != (void *)0x0) {
      __kmp_itt_taskwait_finished
                (in_stack_ffffffffffffff54,
                 (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    pkVar2->td_taskwait_thread = -pkVar2->td_taskwait_thread;
    if (((ulong)ompt_enabled >> 0x10 & 1) != 0) {
      (*ompt_callbacks.ompt_callback_sync_region_wait_callback)
                (ompt_sync_region_taskwait,ompt_scope_end,&poVar4->parallel_data,poVar3,in_RCX);
    }
    if (((ulong)ompt_enabled >> 0x17 & 1) != 0) {
      (*ompt_callbacks.ompt_callback_sync_region_callback)
                (ompt_sync_region_taskwait,ompt_scope_end,&poVar4->parallel_data,poVar3,in_RCX);
    }
    (pkVar2->ompt_task_info).frame.enter_frame.value = 0;
  }
  return 0;
}

Assistant:

static kmp_int32 __kmpc_omp_taskwait_template(ident_t *loc_ref, kmp_int32 gtid,
                                              void *frame_address,
                                              void *return_address) {
  kmp_taskdata_t *taskdata;
  kmp_info_t *thread;
  int thread_finished = FALSE;
  KMP_SET_THREAD_STATE_BLOCK(TASKWAIT);

  KA_TRACE(10, ("__kmpc_omp_taskwait(enter): T#%d loc=%p\n", gtid, loc_ref));

  if (__kmp_tasking_mode != tskm_immediate_exec) {
    thread = __kmp_threads[gtid];
    taskdata = thread->th.th_current_task;

#if OMPT_SUPPORT && OMPT_OPTIONAL
    ompt_data_t *my_task_data;
    ompt_data_t *my_parallel_data;

    if (ompt) {
      my_task_data = &(taskdata->ompt_task_info.task_data);
      my_parallel_data = OMPT_CUR_TEAM_DATA(thread);

      taskdata->ompt_task_info.frame.enter_frame.ptr = frame_address;

      if (ompt_enabled.ompt_callback_sync_region) {
        ompt_callbacks.ompt_callback(ompt_callback_sync_region)(
            ompt_sync_region_taskwait, ompt_scope_begin, my_parallel_data,
            my_task_data, return_address);
      }

      if (ompt_enabled.ompt_callback_sync_region_wait) {
        ompt_callbacks.ompt_callback(ompt_callback_sync_region_wait)(
            ompt_sync_region_taskwait, ompt_scope_begin, my_parallel_data,
            my_task_data, return_address);
      }
    }
#endif // OMPT_SUPPORT && OMPT_OPTIONAL

// Debugger: The taskwait is active. Store location and thread encountered the
// taskwait.
#if USE_ITT_BUILD
// Note: These values are used by ITT events as well.
#endif /* USE_ITT_BUILD */
    taskdata->td_taskwait_counter += 1;
    taskdata->td_taskwait_ident = loc_ref;
    taskdata->td_taskwait_thread = gtid + 1;

#if USE_ITT_BUILD
    void *itt_sync_obj = __kmp_itt_taskwait_object(gtid);
    if (itt_sync_obj != NULL)
      __kmp_itt_taskwait_starting(gtid, itt_sync_obj);
#endif /* USE_ITT_BUILD */

    bool must_wait =
        !taskdata->td_flags.team_serial && !taskdata->td_flags.final;

#if OMP_45_ENABLED
    must_wait = must_wait || (thread->th.th_task_team != NULL &&
                              thread->th.th_task_team->tt.tt_found_proxy_tasks);
#endif
    if (must_wait) {
      kmp_flag_32 flag(RCAST(std::atomic<kmp_uint32> *,
                             &(taskdata->td_incomplete_child_tasks)),
                       0U);
      while (KMP_ATOMIC_LD_ACQ(&taskdata->td_incomplete_child_tasks) != 0) {
        flag.execute_tasks(thread, gtid, FALSE,
                           &thread_finished USE_ITT_BUILD_ARG(itt_sync_obj),
                           __kmp_task_stealing_constraint);
      }
    }
#if USE_ITT_BUILD
    if (itt_sync_obj != NULL)
      __kmp_itt_taskwait_finished(gtid, itt_sync_obj);
#endif /* USE_ITT_BUILD */

    // Debugger:  The taskwait is completed. Location remains, but thread is
    // negated.
    taskdata->td_taskwait_thread = -taskdata->td_taskwait_thread;

#if OMPT_SUPPORT && OMPT_OPTIONAL
    if (ompt) {
      if (ompt_enabled.ompt_callback_sync_region_wait) {
        ompt_callbacks.ompt_callback(ompt_callback_sync_region_wait)(
            ompt_sync_region_taskwait, ompt_scope_end, my_parallel_data,
            my_task_data, return_address);
      }
      if (ompt_enabled.ompt_callback_sync_region) {
        ompt_callbacks.ompt_callback(ompt_callback_sync_region)(
            ompt_sync_region_taskwait, ompt_scope_end, my_parallel_data,
            my_task_data, return_address);
      }
      taskdata->ompt_task_info.frame.enter_frame = ompt_data_none;
    }
#endif // OMPT_SUPPORT && OMPT_OPTIONAL

    ANNOTATE_HAPPENS_AFTER(taskdata);
  }

  KA_TRACE(10, ("__kmpc_omp_taskwait(exit): T#%d task %p finished waiting, "
                "returning TASK_CURRENT_NOT_QUEUED\n",
                gtid, taskdata));

  return TASK_CURRENT_NOT_QUEUED;
}